

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O3

bool __thiscall
Qentem::
HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
::GetKeyIndex(HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
              *this,SizeT *index,Char_T *str,SizeT length)

{
  int *piVar1;
  ulong uVar2;
  HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *pHVar3;
  int iVar4;
  uint uVar5;
  SizeT hash;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  SizeT *tmp;
  SizeT *local_10;
  
  if (this->index_ == 0) {
    return false;
  }
  if (length == 0) {
    hash = 0x8000000b;
  }
  else {
    uVar5 = 0xb;
    uVar2 = (ulong)length;
    iVar4 = 0;
    uVar7 = 0;
    iVar8 = 0x21;
    do {
      iVar9 = iVar4 + iVar8;
      uVar6 = (uint)uVar7;
      piVar1 = str + uVar7;
      iVar4 = iVar4 + 2;
      uVar7 = uVar7 + 1;
      uVar5 = ((uint)uVar2 ^ uVar6) * (iVar8 * uVar6 * *piVar1 + uVar5) + str[uVar2 - 1];
      uVar2 = uVar2 - 1;
      iVar8 = iVar9;
    } while (uVar7 < uVar2);
    hash = uVar5 | 0x80000000;
  }
  pHVar3 = find(this,&local_10,str,length,hash);
  if (pHVar3 != (HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)0x0) {
    *index = *local_10 - 1;
  }
  return pHVar3 != (HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)0x0;
}

Assistant:

inline bool IsEmpty() const noexcept {
        return (Size() == 0);
    }